

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall
QPlainTextEditPrivate::verticalScrollbarActionTriggered(QPlainTextEditPrivate *this,int action)

{
  undefined4 uStack_8;
  
  if (action == 3) {
    uStack_8 = Down;
  }
  else {
    if (action != 4) {
      return;
    }
    uStack_8 = Up;
  }
  pageUpDown(this,uStack_8,MoveAnchor,false);
  return;
}

Assistant:

void QPlainTextEditPrivate::verticalScrollbarActionTriggered(int action) {

    const auto a = static_cast<QAbstractSlider::SliderAction>(action);
    switch (a) {
    case QAbstractSlider::SliderPageStepAdd:
        pageUpDown(QTextCursor::Down, QTextCursor::MoveAnchor, false);
        break;
    case QAbstractSlider::SliderPageStepSub:
        pageUpDown(QTextCursor::Up, QTextCursor::MoveAnchor, false);
        break;
    default:
        break;
    }
}